

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O3

string * __thiscall pbrt::RNG::ToString_abi_cxx11_(string *__return_storage_ptr__,RNG *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<unsigned_long_const&,unsigned_long_const&>
            (__return_storage_ptr__,"[ RNG state: %lu inc: %lu ]",&this->state,&this->inc);
  return __return_storage_ptr__;
}

Assistant:

std::string RNG::ToString() const {
    return StringPrintf("[ RNG state: %" PRIu64 " inc: %" PRIu64 " ]", state, inc);
}